

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O1

int mapFilterRareBiome(Layer *l,int *out,int x,int z,int w,int h)

{
  int iVar1;
  long *plVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  undefined4 in_register_00000014;
  ulong uVar7;
  
  plVar2 = (long *)l->data;
  uVar4 = (*(code *)plVar2[1])(l,out,CONCAT44(in_register_00000014,x));
  if (uVar4 == 0) {
    if (h * w < 1) {
      uVar5 = 0xffffffffffffffff;
      uVar6 = uVar5;
    }
    else {
      uVar7 = 0;
      uVar5 = 0;
      uVar6 = 0;
      do {
        iVar1 = out[uVar7];
        if ((long)iVar1 < 0x80) {
          uVar5 = uVar5 | 1L << ((long)iVar1 & 0x3fU);
        }
        else {
          uVar6 = uVar6 | 1L << ((ulong)(byte)((char)iVar1 + 0x80) & 0x3f);
        }
        uVar7 = uVar7 + 1;
      } while ((uint)(h * w) != uVar7);
      uVar5 = ~uVar5;
      uVar6 = ~uVar6;
    }
    lVar3 = *plVar2;
    if ((*(ulong *)(lVar3 + 0x20) & uVar5) == 0) {
      uVar4 = (uint)((*(ulong *)(lVar3 + 0x28) & uVar6) != 0);
    }
    else {
      uVar4 = 1;
    }
  }
  return uVar4;
}

Assistant:

static int mapFilterRareBiome(const Layer * l, int * out, int x, int z, int w, int h)
{
    const filter_data_t *f = (const filter_data_t*) l->data;
    uint64_t b, bm;
    int i;
    int err;

    err = f->map(l, out, x, z, w, h);
    if unlikely(err != 0)
        return err;

    b = 0; bm = 0;
    for (i = 0; i < w*h; i++)
    {
        int id = out[i];
        if (id < 128) b |= (1ULL << id);
        else bm |= (1ULL << (id-128));
    }
    if ((b & f->bf->raresToFind) ^ f->bf->raresToFind)
        return M_STOP;
    if ((bm & f->bf->raresToFindM) ^ f->bf->raresToFindM)
        return M_STOP;
    return 0;
}